

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.h
# Opt level: O0

void __thiscall iqnet::Socket::Socket(Socket *this,Socket *param_1)

{
  Socket *param_1_local;
  Socket *this_local;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_00254428;
  this->sock = param_1->sock;
  Inet_addr::Inet_addr(&this->peer,&param_1->peer);
  return;
}

Assistant:

class LIBIQXMLRPC_API Socket {
public:
#ifdef _WINDOWS
  typedef SOCKET Handler;
#else
  typedef int Handler;
#endif //_WINDOWS

private:
  Handler sock;
  Inet_addr peer;

public:
  //! Creates TCP, reusable socket.
  Socket();
  //! Create object from existing socket handler.
  Socket( Handler, const Inet_addr& );
  //! Destructor. Does not close actual socket.
  virtual ~Socket() {}

  Handler get_handler() const { return sock; }

  void shutdown();
  void close();

  //! \note Does not disable non-blocking mode under UNIX.
  void set_non_blocking( bool );

  /*! \b Can \b not cause SIGPIPE signal. */
  virtual size_t send( const char*, size_t );
  virtual void send_shutdown( const char*, size_t );
  /*! \b Can \b not cause SIGPIPE signal. */
  virtual size_t recv( char*, size_t );

  void   bind( const Inet_addr& addr );
  void   listen( unsigned backlog = 5 );
  Socket accept();
  bool   connect( const iqnet::Inet_addr& );

  //! Returns an inet addr the socket asscociated with.
  Inet_addr get_addr() const;

  //! Returns peer addr of connected or accepted socket.
  const Inet_addr& get_peer_addr() const { return peer; }

  //! Returns last error occured with socket.
  int get_last_error();
}